

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::torrent::file_priorities
          (torrent *this,vector<download_priority_t,_file_index_t> *files)

{
  bool bVar1;
  int s;
  const_iterator __first;
  const_iterator __last;
  element_type *this_00;
  vector<download_priority_t,_file_index_t> *files_local;
  torrent *this_local;
  
  __first = ::std::
            vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
            ::begin(&(this->m_file_priority).
                     super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                   );
  __last = ::std::
           vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
           ::end(&(this->m_file_priority).
                  super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                );
  ::std::
  vector<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>,std::allocator<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>>>
  ::
  assign<__gnu_cxx::__normal_iterator<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>const*,std::vector<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>,std::allocator<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>>>>,void>
            ((vector<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>,std::allocator<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>>>
              *)files,(__normal_iterator<const_libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_*,_std::vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
                       )__first._M_current,
             (__normal_iterator<const_libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_*,_std::vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
              )__last._M_current);
  bVar1 = valid_metadata(this);
  if (bVar1) {
    this_00 = ::std::
              __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&(this->super_torrent_hot_members).m_torrent_file);
    s = torrent_info::num_files(this_00);
    container_wrapper<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,std::vector<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>,std::allocator<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>>>>
    ::resize<int,void>((container_wrapper<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,std::vector<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>,std::allocator<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>>>>
                        *)files,s,
                       (strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void> *)
                       &default_priority);
  }
  return;
}

Assistant:

void torrent::file_priorities(aux::vector<download_priority_t, file_index_t>* files) const
	{
		INVARIANT_CHECK;

		files->assign(m_file_priority.begin(), m_file_priority.end());

		if (!valid_metadata())
		{
			return;
		}

		files->resize(m_torrent_file->num_files(), default_priority);
	}